

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.cc
# Opt level: O0

timeval absl::ToTimeval(Duration d)

{
  timeval tVar1;
  __time_t _Var2;
  undefined8 in_RDX;
  Duration d_00;
  undefined1 local_38 [8];
  timespec ts;
  Duration d_local;
  timeval tv;
  
  d_00._8_8_ = in_RDX;
  d_00.rep_hi_ = (ulong)d.rep_lo_;
  _local_38 = ToTimespec((absl *)d.rep_hi_,d_00);
  if ((long)local_38 < 0) {
    _Var2 = ts.tv_sec;
    ts.tv_sec = ts.tv_sec + 999;
    if (999999999 < ts.tv_sec) {
      ts.tv_sec = _Var2 + -0x3b9ac619;
      local_38 = (undefined1  [8])((long)local_38 + 1);
    }
  }
  tVar1.tv_usec = (long)(int)(ts.tv_sec / 1000);
  tVar1.tv_sec = (__time_t)local_38;
  return tVar1;
}

Assistant:

timeval ToTimeval(Duration d) {
  timeval tv;
  timespec ts = ToTimespec(d);
  if (ts.tv_sec < 0) {
    // Tweak the fields so that positive division of tv_nsec
    // maps to truncation (towards zero) for the timeval.
    ts.tv_nsec += 1000 - 1;
    if (ts.tv_nsec >= 1000 * 1000 * 1000) {
      ts.tv_sec += 1;
      ts.tv_nsec -= 1000 * 1000 * 1000;
    }
  }
  tv.tv_sec = ts.tv_sec;
  if (tv.tv_sec != ts.tv_sec) {  // narrowing
    if (ts.tv_sec < 0) {
      tv.tv_sec = std::numeric_limits<decltype(tv.tv_sec)>::min();
      tv.tv_usec = 0;
    } else {
      tv.tv_sec = std::numeric_limits<decltype(tv.tv_sec)>::max();
      tv.tv_usec = 1000 * 1000 - 1;
    }
    return tv;
  }
  tv.tv_usec = static_cast<int>(ts.tv_nsec / 1000);  // suseconds_t
  return tv;
}